

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm_file_dumper.cpp
# Opt level: O1

void __thiscall VGMFileDumper::nativeGenerateN(VGMFileDumper *this,int16_t *output,size_t frames)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  
  if (((this->m_output != (FILE *)0x0) && (this->m_chip_index < 1)) && (this->m_end_caught == false)
     ) {
    memset(output,0,frames * 4);
    auVar2._8_4_ = (int)(frames >> 0x20);
    auVar2._0_8_ = frames;
    auVar2._12_4_ = 0x45300000;
    dVar3 = (44100.0 / (double)this->m_actual_rate) *
            ((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)frames) - 4503599627370496.0));
    uVar1 = (ulong)dVar3;
    this->m_delay =
         this->m_delay + ((long)(dVar3 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1);
  }
  return;
}

Assistant:

void VGMFileDumper::nativeGenerateN(int16_t *output, size_t frames)
{
    if(!m_output)
        return;
    if(m_chip_index > 0 || m_end_caught) // When it's a second chip
        return;
    std::memset(output, 0, frames * sizeof(int16_t) * 2);
    m_delay += size_t(frames * (44100.0 / double(m_actual_rate)));
}